

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined1 local_30 [8];
  sockaddr_in saddr;
  uint16_t port_local;
  uint32_t ipaddr_local;
  Socket *this_local;
  
  saddr.sin_zero._2_2_ = SUB82(__addr,0);
  local_30._0_2_ = 2;
  saddr.sin_zero._4_4_ = __fd;
  local_30._4_4_ = htonl(__fd);
  local_30._2_2_ = htons(saddr.sin_zero._2_2_);
  iVar1 = ::bind(this->_fd,(sockaddr *)local_30,0x10);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != -1);
}

Assistant:

bool Socket::bind( uint32_t ipaddr, uint16_t port )
{
    struct sockaddr_in saddr;
    saddr.sin_family = AF_INET;
    saddr.sin_addr.s_addr = htonl(ipaddr);
    saddr.sin_port = htons(port);
    if(::bind(_fd, (const struct sockaddr *)&saddr, sizeof(saddr)) == SOCKET_ERROR)
        return false;
    return true;
}